

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O2

void __thiscall
dna_bwt_n<dna_string_n>::dna_bwt_n(dna_bwt_n<dna_string_n> *this,string *path,char TERM)

{
  dna_string_n *this_00;
  char cVar1;
  uint64_t uVar2;
  uint64_t i;
  ulong i_00;
  string sStack_c8;
  string local_a8;
  dna_string_n local_88;
  
  this_00 = &this->BWT;
  this->F_N = 0;
  this->F_T = 0;
  this->F_C = 0;
  this->F_G = 0;
  this->n = 0;
  this->F_A = 0;
  (this->BWT).TERM = '#';
  (this->BWT).n_superblocks = 0;
  (this->BWT).n_blocks = 0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BWT).data = (uint8_t *)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BWT).nbytes = 0;
  (this->BWT).n = 0;
  this->TERM = TERM;
  std::__cxx11::string::string((string *)&local_a8,(string *)path);
  uVar2 = filesize(&local_a8);
  this->n = uVar2;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&sStack_c8,(string *)path);
  dna_string_n::dna_string_n(&local_88,&sStack_c8,TERM);
  dna_string_n::operator=(this_00,&local_88);
  dna_string_n::~dna_string_n(&local_88);
  std::__cxx11::string::~string((string *)&sStack_c8);
  for (i_00 = 0; i_00 < this->n; i_00 = i_00 + 1) {
    cVar1 = dna_string_n::operator[](this_00,i_00);
    this->F_A = this->F_A + (ulong)(cVar1 == TERM);
    cVar1 = dna_string_n::operator[](this_00,i_00);
    this->F_C = this->F_C + (ulong)(cVar1 == 'A');
    cVar1 = dna_string_n::operator[](this_00,i_00);
    this->F_G = this->F_G + (ulong)(cVar1 == 'C');
    cVar1 = dna_string_n::operator[](this_00,i_00);
    this->F_N = this->F_N + (ulong)(cVar1 == 'G');
    cVar1 = dna_string_n::operator[](this_00,i_00);
    this->F_T = this->F_T + (ulong)(cVar1 == 'N');
  }
  uVar2 = this->F_C + this->F_A;
  this->F_C = uVar2;
  uVar2 = uVar2 + this->F_G;
  this->F_G = uVar2;
  uVar2 = uVar2 + this->F_N;
  this->F_N = uVar2;
  this->F_T = this->F_T + uVar2;
  return;
}

Assistant:

dna_bwt_n(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		BWT = str_type(path, TERM);

		uint64_t n_term = 0;

		//build F column
		for(uint64_t i=0;i<n;++i){

			assert(BWT[i] < 256);

			F_A += (BWT[i]==TERM);
			F_C += (BWT[i]=='A');
			F_G += (BWT[i]=='C');
			F_N += (BWT[i]=='G');
			F_T += (BWT[i]=='N');

		}

		F_C += F_A;
		F_G += F_C;
		F_N += F_G;
		F_T += F_N;

	}